

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void wide_bit_sum(RK_U8 *data,RK_U32 len,RK_ULONG *sum)

{
  RK_U32 *data_rk;
  RK_U32 loop;
  RK_U8 *data8;
  RK_ULONG *sum_local;
  RK_U32 len_local;
  RK_U8 *data_local;
  
  for (data_rk._4_4_ = 0; data_rk._4_4_ < len >> 2; data_rk._4_4_ = data_rk._4_4_ + 1) {
    *sum = (ulong)*(uint *)(data + (ulong)data_rk._4_4_ * 4) + *sum;
  }
  for (data_rk._4_4_ = len & 0xfffffffc; data_rk._4_4_ < len; data_rk._4_4_ = data_rk._4_4_ + 1) {
    *sum = (ulong)data[data_rk._4_4_] + *sum;
  }
  return;
}

Assistant:

void wide_bit_sum(RK_U8 *data, RK_U32 len, RK_ULONG *sum)
{
    RK_U8   *data8 = NULL;
    RK_U32  loop;
    data8 = data;
#if LONG_MAX == INT_MAX
    RK_U16 *data_rk = NULL;
    data_rk = (RK_U16 *)data;
#else
    RK_U32 *data_rk = NULL;
    data_rk = (RK_U32 *)data;
#endif

    for (loop = 0; loop < len / CAL_BYTE; loop++) {
        *sum += data_rk[loop];
    }
    for (loop = len / CAL_BYTE * CAL_BYTE; loop < len; loop++) {
        *sum += data8[loop];
    }

    return;
}